

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O3

adt_bytearray_t * adt_bytearray_new(uint32_t u32GrowSize)

{
  adt_bytearray_t *paVar1;
  uint32_t uVar2;
  
  paVar1 = (adt_bytearray_t *)malloc(0x18);
  if (paVar1 != (adt_bytearray_t *)0x0) {
    uVar2 = 0x2000;
    if (u32GrowSize < 0x2000001) {
      uVar2 = u32GrowSize;
    }
    paVar1->pData = (uint8_t *)0x0;
    paVar1->u32CurLen = 0;
    paVar1->u32AllocLen = 0;
    paVar1->u32GrowSize = uVar2;
  }
  return paVar1;
}

Assistant:

adt_bytearray_t *adt_bytearray_new(uint32_t u32GrowSize)
{
   adt_bytearray_t *self = (adt_bytearray_t*) malloc(sizeof(adt_bytearray_t));
   if(self != 0){
      adt_bytearray_create(self,u32GrowSize);
   }
   return self;
}